

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  string *type_url_00;
  FieldDescriptor *pFVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  Descriptor *this_00;
  FileDescriptor *this_01;
  DescriptorPool *this_02;
  LogMessage *pLVar5;
  Message *pMVar6;
  undefined4 extraout_var;
  MessageLite *this_03;
  second_type *ppFVar7;
  AlphaNum *in_R8;
  string local_270;
  string local_250;
  FieldValuePrinter *local_230;
  second_type local_228;
  FieldValuePrinter *printer;
  AlphaNum local_1f0;
  AlphaNum local_1c0;
  string local_190;
  LogFinisher local_169;
  LogMessage local_168;
  undefined1 local_130 [8];
  string serialized_value;
  scoped_ptr<google::protobuf::Message> value_message;
  DynamicMessageFactory factory;
  LogMessage local_d8;
  Descriptor *local_a0;
  Descriptor *value_descriptor;
  undefined1 local_88 [8];
  string full_type_name;
  string *type_url;
  Reflection *reflection;
  FieldDescriptor *value_field;
  FieldDescriptor *type_url_field;
  TextGenerator *generator_local;
  Message *message_local;
  Printer *this_local;
  
  type_url_field = (FieldDescriptor *)generator;
  generator_local = (TextGenerator *)message;
  message_local = (Message *)this;
  bVar2 = internal::GetAnyFieldDescriptors(message,&value_field,(FieldDescriptor **)&reflection);
  if (bVar2) {
    plVar4 = (long *)(*(code *)generator_local->output_[0x16]._vptr_ZeroCopyOutputStream)();
    type_url_00 = (string *)(&full_type_name.field_2._M_allocated_capacity + 1);
    (**(code **)(*plVar4 + 0xc0))(type_url_00,plVar4,generator_local,value_field);
    std::__cxx11::string::string((string *)local_88);
    bVar2 = internal::ParseAnyTypeUrl(type_url_00,(string *)local_88);
    if (bVar2) {
      this_00 = Message::GetDescriptor((Message *)generator_local);
      this_01 = Descriptor::file(this_00);
      this_02 = FileDescriptor::pool(this_01);
      local_a0 = DescriptorPool::FindMessageTypeByName(this_02,(string *)local_88);
      if (local_a0 == (Descriptor *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x62d);
        pLVar5 = internal::LogMessage::operator<<(&local_d8,"Proto type ");
        pLVar5 = internal::LogMessage::operator<<(pLVar5,type_url_00);
        pLVar5 = internal::LogMessage::operator<<(pLVar5," not found");
        internal::LogFinisher::operator=
                  ((LogFinisher *)((long)&factory.prototypes_mutex_.mInternal + 7),pLVar5);
        internal::LogMessage::~LogMessage(&local_d8);
        this_local._7_1_ = 0;
        value_descriptor._0_4_ = 1;
      }
      else {
        DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&value_message);
        pMVar6 = DynamicMessageFactory::GetPrototype
                           ((DynamicMessageFactory *)&value_message,local_a0);
        iVar3 = (*(pMVar6->super_MessageLite)._vptr_MessageLite[3])();
        internal::scoped_ptr<google::protobuf::Message>::scoped_ptr
                  ((scoped_ptr<google::protobuf::Message> *)((long)&serialized_value.field_2 + 8),
                   (Message *)CONCAT44(extraout_var,iVar3));
        (**(code **)(*plVar4 + 0xc0))(local_130,plVar4,generator_local,reflection);
        this_03 = &internal::scoped_ptr<google::protobuf::Message>::operator->
                             ((scoped_ptr<google::protobuf::Message> *)
                              ((long)&serialized_value.field_2 + 8))->super_MessageLite;
        bVar2 = MessageLite::ParseFromString(this_03,(string *)local_130);
        pFVar1 = type_url_field;
        if (bVar2) {
          strings::AlphaNum::AlphaNum(&local_1c0,"[");
          strings::AlphaNum::AlphaNum(&local_1f0,type_url_00);
          strings::AlphaNum::AlphaNum((AlphaNum *)&printer,"]");
          StrCat_abi_cxx11_(&local_190,(protobuf *)&local_1c0,&local_1f0,(AlphaNum *)&printer,in_R8)
          ;
          TextGenerator::Print((TextGenerator *)pFVar1,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          local_230 = internal::scoped_ptr<const_google::protobuf::TextFormat::FieldValuePrinter>::
                      get(&this->default_field_value_printer_);
          ppFVar7 = FindWithDefault<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
                              (&this->custom_printers_,(first_type *)&reflection,&local_230);
          pFVar1 = type_url_field;
          local_228 = *ppFVar7;
          (*local_228->_vptr_FieldValuePrinter[0xd])
                    (&local_250,local_228,generator_local,0xffffffff,0,
                     (ulong)(this->single_line_mode_ & 1));
          TextGenerator::Print((TextGenerator *)pFVar1,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          TextGenerator::Indent((TextGenerator *)type_url_field);
          pMVar6 = internal::scoped_ptr<google::protobuf::Message>::operator*
                             ((scoped_ptr<google::protobuf::Message> *)
                              ((long)&serialized_value.field_2 + 8));
          Print(this,pMVar6,(TextGenerator *)type_url_field);
          TextGenerator::Outdent((TextGenerator *)type_url_field);
          pFVar1 = type_url_field;
          (*local_228->_vptr_FieldValuePrinter[0xe])
                    (&local_270,local_228,generator_local,0xffffffff,0,
                     (ulong)(this->single_line_mode_ & 1));
          TextGenerator::Print((TextGenerator *)pFVar1,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
        }
        else {
          internal::LogMessage::LogMessage
                    (&local_168,LOGLEVEL_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                     ,0x635);
          pLVar5 = internal::LogMessage::operator<<(&local_168,type_url_00);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,": failed to parse contents");
          internal::LogFinisher::operator=(&local_169,pLVar5);
          internal::LogMessage::~LogMessage(&local_168);
        }
        value_descriptor._0_4_ = 1;
        this_local._7_1_ = bVar2;
        std::__cxx11::string::~string((string *)local_130);
        internal::scoped_ptr<google::protobuf::Message>::~scoped_ptr
                  ((scoped_ptr<google::protobuf::Message> *)((long)&serialized_value.field_2 + 8));
        DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&value_message);
      }
    }
    else {
      this_local._7_1_ = 0;
      value_descriptor._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)(full_type_name.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator& generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const string& type_url = reflection->GetString(message, type_url_field);
  string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const google::protobuf::Descriptor* value_descriptor =
      message.GetDescriptor()->file()->pool()->FindMessageTypeByName(
          full_type_name);
  if (value_descriptor == NULL) {
    GOOGLE_LOG(WARNING) << "Proto type " << type_url << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  google::protobuf::scoped_ptr<google::protobuf::Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator.Print(StrCat("[", type_url, "]"));
  const FieldValuePrinter* printer = FindWithDefault(
      custom_printers_, value_field, default_field_value_printer_.get());
  generator.Print(
      printer->PrintMessageStart(message, -1, 0, single_line_mode_));
  generator.Indent();
  Print(*value_message, generator);
  generator.Outdent();
  generator.Print(printer->PrintMessageEnd(message, -1, 0, single_line_mode_));
  return true;
}